

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O1

int CCharmap::name_is_ucs2le_synonym(char *table_name)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = stricmp(table_name,"utf-16le");
  uVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = stricmp(table_name,"utf16le");
    if (iVar1 != 0) {
      iVar1 = stricmp(table_name,"utf_16le");
      if (iVar1 != 0) {
        iVar1 = stricmp(table_name,"unicodel");
        if (iVar1 != 0) {
          iVar1 = stricmp(table_name,"unicode-l");
          if (iVar1 != 0) {
            iVar1 = stricmp(table_name,"unicode-le");
            if (iVar1 != 0) {
              iVar1 = stricmp(table_name,"ucs-2le");
              if (iVar1 != 0) {
                iVar1 = stricmp(table_name,"ucs2le");
                uVar2 = (uint)(iVar1 == 0);
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int name_is_ucs2le_synonym(const char *table_name)
    {
        return (stricmp(table_name, "utf-16le") == 0
                || stricmp(table_name, "utf16le") == 0
                || stricmp(table_name, "utf_16le") == 0
                || stricmp(table_name, "unicodel") == 0
                || stricmp(table_name, "unicode-l") == 0
                || stricmp(table_name, "unicode-le") == 0
                || stricmp(table_name, "ucs-2le") == 0
                || stricmp(table_name, "ucs2le") == 0);
    }